

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_normdev(REF_CAVITY ref_cavity,REF_BOOL *improved)

{
  int iVar1;
  REF_GRID ref_grid;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  int iVar3;
  uint uVar4;
  REF_STATUS RVar5;
  REF_LIST pRVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  REF_DBL uv_area;
  REF_DBL sign_uv_area;
  REF_DBL normdev;
  REF_INT nodes [27];
  undefined4 local_118;
  undefined4 uStack_114;
  double local_108;
  double local_100;
  double local_f8;
  int local_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uint *local_d8;
  REF_GEOM local_d0;
  double local_c8;
  undefined8 uStack_c0;
  REF_NODE local_b0;
  int local_a8;
  undefined4 local_a4;
  int local_a0;
  REF_INT local_9c;
  
  ref_grid = ref_cavity->ref_grid;
  local_ec = ref_cavity->surf_node;
  if (local_ec == -1) {
    local_ec = ref_cavity->node;
  }
  local_b0 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  local_d0 = ref_grid->geom;
  *improved = 1;
  pRVar6 = ref_cavity->tri_list;
  local_d8 = (uint *)improved;
  if (pRVar6->n < 1) {
    local_e8 = 0;
    uStack_e4 = 0x40000000;
    uStack_e0 = 0;
    uStack_dc = 0;
    local_118 = 0xd7d7625a;
    uStack_114 = 0x6974e718;
  }
  else {
    local_118 = 0xd7d7625a;
    uStack_114 = 0x6974e718;
    local_e8 = 0;
    uStack_e4 = 0x40000000;
    uStack_e0 = 0;
    uStack_dc = 0;
    lVar9 = 0;
    do {
      uVar4 = ref_cell_nodes(ref_cell,pRVar6->value[lVar9],&local_a8);
      if (uVar4 != 0) {
        pcVar8 = "cell";
        uVar7 = 0x995;
        goto LAB_001b2303;
      }
      uVar4 = ref_geom_tri_norm_deviation(ref_grid,&local_a8,&local_f8);
      if (uVar4 != 0) {
        pcVar8 = "old tri normdev";
        uVar7 = 0x997;
        goto LAB_001b2303;
      }
      if (local_f8 <= (double)CONCAT44(uStack_e4,local_e8)) {
        local_e8 = SUB84(local_f8,0);
        uStack_e4 = (undefined4)((ulong)local_f8 >> 0x20);
      }
      if (local_d0->meshlink == (void *)0x0) {
        uVar4 = ref_geom_uv_area(local_d0,&local_a8,&local_108);
        if (uVar4 != 0) {
          pcVar8 = "uv area";
          uVar7 = 0x99a;
          goto LAB_001b2303;
        }
        uVar4 = ref_geom_uv_area_sign(ref_grid,local_9c,&local_100);
        if (uVar4 != 0) {
          pcVar8 = "sign";
          uVar7 = 0x99b;
          goto LAB_001b2303;
        }
        local_108 = local_100 * local_108;
        dVar13 = (double)CONCAT44(uStack_114,local_118);
        if (local_108 <= (double)CONCAT44(uStack_114,local_118)) {
          dVar13 = local_108;
        }
        local_118 = SUB84(dVar13,0);
        uStack_114 = (undefined4)((ulong)dVar13 >> 0x20);
      }
      lVar9 = lVar9 + 1;
      pRVar6 = ref_cavity->tri_list;
    } while (lVar9 < pRVar6->n);
  }
  if (ref_cavity->debug != 0) {
    printf("- min %12.8f %12.8f\n",local_e8,CONCAT44(uStack_114,local_118));
  }
  iVar3 = local_ec;
  if (ref_cavity->maxseg < 1) {
    uVar11 = 0;
    uVar12 = 0x40000000;
    local_c8 = 1e+200;
    uStack_c0 = 0;
  }
  else {
    local_c8 = 1e+200;
    uStack_c0 = 0;
    uVar11 = 0;
    uVar12 = 0x40000000;
    lVar9 = 8;
    lVar10 = 0;
    do {
      pRVar2 = ref_cavity->s2n;
      iVar1 = *(int *)((long)pRVar2 + lVar9 + -8);
      if (((iVar1 != -1) && (iVar3 != *(int *)((long)pRVar2 + lVar9 + -4))) && (iVar3 != iVar1)) {
        local_a4 = *(undefined4 *)((long)pRVar2 + lVar9 + -4);
        local_a0 = iVar3;
        local_9c = *(REF_INT *)((long)pRVar2 + lVar9);
        local_a8 = iVar1;
        RVar5 = ref_geom_tri_norm_deviation(ref_grid,&local_a8,&local_f8);
        if (RVar5 != 0) {
          *local_d8 = 0;
          return 0;
        }
        if (local_f8 <= (double)CONCAT44(uVar12,uVar11)) {
          uVar11 = SUB84(local_f8,0);
          uVar12 = (undefined4)((ulong)local_f8 >> 0x20);
        }
        if (local_d0->meshlink == (void *)0x0) {
          uVar4 = ref_geom_uv_area(local_d0,&local_a8,&local_108);
          if (uVar4 != 0) {
            pcVar8 = "uv area";
            uVar7 = 0x9bb;
LAB_001b2303:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar7,"ref_cavity_normdev",(ulong)uVar4,pcVar8);
            return uVar4;
          }
          uVar4 = ref_geom_uv_area_sign(ref_grid,local_9c,&local_100);
          if (uVar4 != 0) {
            pcVar8 = "sign";
            uVar7 = 0x9bc;
            goto LAB_001b2303;
          }
          local_108 = local_100 * local_108;
          if (local_108 <= local_c8) {
            local_c8 = local_108;
          }
        }
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar10 < ref_cavity->maxseg);
  }
  if (ref_cavity->debug != 0) {
    printf("+ min %12.8f %12.8f\n",uVar11);
  }
  *local_d8 = -(uint)((double)CONCAT44(uStack_e4,local_e8) < (double)CONCAT44(uVar12,uVar11) &&
                     local_b0->min_uv_area < local_c8) & 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_normdev(REF_CAVITY ref_cavity,
                                      REF_BOOL *improved) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node;
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normdev, min_normdev, old_normdev;
  REF_DBL sign_uv_area, uv_area, min_uv_area;
  REF_INT seg, seg_node;
  REF_BOOL skip;

  node = ref_cavity_seg_node(ref_cavity);

  *improved = REF_TRUE;

  min_normdev = 2.0;
  min_uv_area = REF_DBL_MAX;
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev),
        "old tri normdev");
    min_normdev = MIN(min_normdev, normdev);
    if (!ref_geom_meshlinked(ref_geom)) {
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;
      min_uv_area = MIN(min_uv_area, uv_area);
    }
  }
  old_normdev = min_normdev;

  if (ref_cavity_debug(ref_cavity))
    printf("- min %12.8f %12.8f\n", min_normdev, min_uv_area);

  min_normdev = 2.0;
  min_uv_area = REF_DBL_MAX;
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      if (node == ref_cavity_s2n(ref_cavity, seg_node, seg)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      nodes[seg_node] = ref_cavity_s2n(ref_cavity, seg_node, seg);
    }
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);
    if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev)) {
      *improved = REF_FALSE;
      return REF_SUCCESS;
    }
    min_normdev = MIN(min_normdev, normdev);
    if (!ref_geom_meshlinked(ref_geom)) {
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;
      min_uv_area = MIN(min_uv_area, uv_area);
    }
  }
  if (ref_cavity_debug(ref_cavity))
    printf("+ min %12.8f %12.8f\n", min_normdev, min_uv_area);

  *improved = (min_uv_area > ref_node_min_uv_area(ref_node) &&
               min_normdev > old_normdev);

  return REF_SUCCESS;
}